

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TestSpec::serializeTo(TestSpec *this,ostream *out)

{
  pointer pFVar1;
  bool bVar2;
  Filter *filter;
  pointer this_00;
  
  pFVar1 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (this_00 = (this->m_filters).
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pFVar1; this_00 = this_00 + 1
      ) {
    if (!bVar2) {
      std::operator<<(out,',');
    }
    Filter::serializeTo(this_00,out);
    bVar2 = false;
  }
  return;
}

Assistant:

void TestSpec::serializeTo( std::ostream& out ) const {
        bool first = true;
        for ( auto const& filter : m_filters ) {
            if ( !first ) {
                out << ',';
            }
            out << filter;
            first = false;
        }
    }